

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chizu.c
# Opt level: O0

chizu * chizu_create(void)

{
  czmap *pcVar1;
  chizu *cz;
  
  cz = chizu_internal_alloc();
  (cz->size).w = 2;
  (cz->size).h = 2;
  pcVar1 = czmap_create((cz->size).w,(cz->size).h);
  cz->map = pcVar1;
  if (cz->map == (czmap *)0x0) {
    chizu_internal_free(cz);
    cz = (chizu *)0x0;
  }
  return cz;
}

Assistant:

chizu * chizu_create() {
    chizu * cz = chizu_internal_alloc();
    cz->size.w = 2;
    cz->size.h = 2;

    cz->map = czmap_create(cz->size.w, cz->size.h);
    if (cz->map == NULL) {
        chizu_internal_free(cz);
        return NULL;
    }
    return cz;
}